

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O1

bool jessilib::equalsi<char32_t,char8_t>
               (basic_string_view<char32_t,_std::char_traits<char32_t>_> lhs,
               basic_string_view<char8_t,_std::char_traits<char8_t>_> rhs)

{
  wchar32 wVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char8_t *pcVar5;
  size_t sVar6;
  jessilib *this;
  size_t sVar7;
  wchar32 *pwVar8;
  decode_result dVar9;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string;
  
  pwVar8 = lhs._M_str;
  sVar7 = lhs._M_len;
  pcVar5 = rhs._M_str;
  this = (jessilib *)rhs._M_len;
  do {
    if ((sVar7 == 0) || (this == (jessilib *)0x0)) {
      return sVar7 == 0 && this == (jessilib *)0x0;
    }
    wVar1 = *pwVar8;
    in_string._M_str = (char8_t *)this;
    in_string._M_len = (size_t)pcVar5;
    dVar9 = decode_codepoint_utf8<char8_t>(this,in_string);
    sVar6 = dVar9.units;
    if (sVar6 == 0) {
LAB_0023936a:
      bVar2 = false;
    }
    else {
      if (wVar1 != dVar9.codepoint) {
        iVar3 = jessilib::fold(wVar1);
        iVar4 = jessilib::fold(dVar9.codepoint);
        if (iVar3 != iVar4) goto LAB_0023936a;
      }
      pwVar8 = pwVar8 + 1;
      sVar7 = sVar7 - 1;
      pcVar5 = pcVar5 + sVar6;
      this = this + -sVar6;
      bVar2 = true;
    }
    if (!bVar2) {
      return false;
    }
  } while( true );
}

Assistant:

bool equalsi(std::basic_string_view<LhsCharT> lhs, std::basic_string_view<RhsCharT> rhs) {
	// If lhs and rhs are the same type, compare their sizes and quickly return if not same
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (lhs.size() != rhs.size()) {
			return false;
		}
	}

	while (!lhs.empty() && !rhs.empty()) {
		auto lhs_front = decode_codepoint(lhs);
		auto rhs_front = decode_codepoint(rhs);

		if (lhs_front.units == 0
			|| rhs_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return false;
		}

		if (!equalsi(lhs_front.codepoint, rhs_front.codepoint)) {
			// Codepoints don't fold to same value
			return false;
		}

		// Codepoints are equal; trim off the fronts and continue
		lhs.remove_prefix(lhs_front.units);
		rhs.remove_prefix(rhs_front.units);
	}

	return lhs.empty() && rhs.empty();
}